

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

void art_replace(art_inner_node_t *node,art_key_chunk_t key_chunk,art_node_t *new_child)

{
  uint8_t uVar1;
  art_node_t *in_RDX;
  art_key_chunk_t in_SIL;
  art_node256_t *in_RDI;
  
  uVar1 = art_get_type(&in_RDI->base);
  switch(uVar1) {
  case '\0':
    art_node4_replace((art_node4_t *)in_RDI,in_SIL,in_RDX);
    break;
  case '\x01':
    art_node16_replace((art_node16_t *)in_RDI,in_SIL,in_RDX);
    break;
  case '\x02':
    art_node48_replace((art_node48_t *)in_RDI,in_SIL,in_RDX);
    break;
  case '\x03':
    art_node256_replace(in_RDI,in_SIL,in_RDX);
  }
  return;
}

Assistant:

static void art_replace(art_inner_node_t *node, art_key_chunk_t key_chunk,
                        art_node_t *new_child) {
    switch (art_get_type(node)) {
        case ART_NODE4_TYPE:
            art_node4_replace((art_node4_t *)node, key_chunk, new_child);
            break;
        case ART_NODE16_TYPE:
            art_node16_replace((art_node16_t *)node, key_chunk, new_child);
            break;
        case ART_NODE48_TYPE:
            art_node48_replace((art_node48_t *)node, key_chunk, new_child);
            break;
        case ART_NODE256_TYPE:
            art_node256_replace((art_node256_t *)node, key_chunk, new_child);
            break;
        default:
            assert(false);
    }
}